

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Params.cpp
# Opt level: O2

void __thiscall Params::setparams(Params *this,char *config_file)

{
  FILE *__stream;
  uint i;
  int iVar1;
  int iVar2;
  
  __stream = fopen(config_file,"r");
  iVar2 = 0;
  __isoc99_fscanf(__stream,"MAX_NNB: %d",this);
  __isoc99_fscanf(__stream,"\nSINGLE_FAILURE: %d",&this->SINGLE_FAILURE);
  __isoc99_fscanf(__stream,"\nDROP_MSG: %d",&this->DROP_MSG);
  __isoc99_fscanf(__stream,"\nMSG_DROP_PROB: %lf",&this->MSG_DROP_PROB);
  this->EN_GPSZ = this->MAX_NNB;
  this->STEP_RATE = 0.25;
  this->MAX_MSG_SIZE = 4000;
  this->dropmsg = 0;
  this->globaltime = 0;
  this->allNodesJoined = 0;
  for (iVar1 = 0; this->MAX_NNB != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = iVar2 + iVar1;
    this->allNodesJoined = iVar2;
  }
  fclose(__stream);
  return;
}

Assistant:

void Params::setparams(char *config_file) {
	FILE *fp = fopen(config_file,"r");

	fscanf(fp,"MAX_NNB: %d", &MAX_NNB);
	fscanf(fp,"\nSINGLE_FAILURE: %d", &SINGLE_FAILURE);
	fscanf(fp,"\nDROP_MSG: %d", &DROP_MSG);
	fscanf(fp,"\nMSG_DROP_PROB: %lf", &MSG_DROP_PROB);

	//printf("Parameters of the test case: %d %d %d %lf\n", MAX_NNB, SINGLE_FAILURE, DROP_MSG, MSG_DROP_PROB);

	EN_GPSZ = MAX_NNB;
	STEP_RATE=.25;
	MAX_MSG_SIZE = 4000;
	globaltime = 0;
	dropmsg = 0;
	allNodesJoined = 0;
	for ( unsigned int i = 0; i < EN_GPSZ; i++ ) {
		allNodesJoined += i;
	}
	fclose(fp);
	return;
}